

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlrole.c
# Opt level: O1

int prolog2(PROLOG_STATE *state,int tok,char *ptr,char *end,ENCODING *enc)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  
  uVar3 = tok - 0xbU >> 1 | (uint)((tok - 0xbU & 1) != 0) << 0x1f;
  iVar1 = 0;
  if ((2 < uVar3) &&
     (((iVar2 = 2, uVar3 == 9 || (iVar2 = -1, tok != 0x1c)) ||
      (iVar1 = 0x34, state->documentEntity != 0)))) {
    state->handler = error;
    return iVar2;
  }
  return iVar1;
}

Assistant:

static
int prolog2(PROLOG_STATE *state,
            int tok,
            const char *ptr,
            const char *end,
            const ENCODING *enc)
{
  cmExpatUnused(ptr);
  cmExpatUnused(end);
  cmExpatUnused(enc);
  switch (tok) {
  case XML_TOK_PROLOG_S:
    return XML_ROLE_NONE;
  case XML_TOK_PI:
  case XML_TOK_COMMENT:
    return XML_ROLE_NONE;
  case XML_TOK_INSTANCE_START:
    state->handler = error;
    return XML_ROLE_INSTANCE_START;
  }
  return common(state, tok);
}